

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mercuryparser.cpp
# Opt level: O2

void __thiscall MercuryJson::JSON::exec_stage1(JSON *this)

{
  size_t *base;
  longlong *plVar1;
  size_t sVar2;
  size_t *psVar3;
  uint64_t uVar4;
  uint64_t pseudo_structural_mask;
  size_t sVar5;
  runtime_error *this_00;
  size_t offset;
  uint64_t prev_quote_mask;
  uint64_t whitespace_mask;
  uint64_t structural_mask;
  uint64_t quote_mask;
  uint64_t prev_pseudo_mask;
  uint64_t prev_escape_mask;
  Warp warp;
  uint64_t local_d0;
  uint64_t local_c8;
  uint64_t local_c0;
  uint64_t local_b8 [3];
  Warp local_a0;
  
  local_b8[2] = 0;
  local_d0 = 0;
  local_b8[1] = 1;
  base = &this->num_indices;
  pseudo_structural_mask = 0;
  offset = 0xffffffffffffffc0;
  while (offset + 0x40 < this->input_len) {
    plVar1 = (longlong *)(this->input + offset + 0x40);
    local_a0.lo[0] = *plVar1;
    local_a0.lo[1] = plVar1[1];
    local_a0.lo[2] = plVar1[2];
    local_a0.lo[3] = plVar1[3];
    plVar1 = (longlong *)(this->input + offset + 0x60);
    local_a0.hi[0] = *plVar1;
    local_a0.hi[1] = plVar1[1];
    local_a0.hi[2] = plVar1[2];
    local_a0.hi[3] = plVar1[3];
    uVar4 = extract_escape_mask(&local_a0,local_b8 + 2);
    uVar4 = extract_literal_mask(&local_a0,uVar4,&local_d0,local_b8);
    construct_structural_character_pointers(pseudo_structural_mask,offset,this->indices,base);
    extract_structural_whitespace_characters(&local_a0,uVar4,&local_c0,&local_c8);
    pseudo_structural_mask =
         extract_pseudo_structural_mask(local_c0,local_c8,local_b8[0],uVar4,local_b8 + 1);
    offset = offset + 0x40;
  }
  construct_structural_character_pointers(pseudo_structural_mask,offset,this->indices,base);
  sVar2 = this->num_indices;
  psVar3 = this->indices;
  if ((sVar2 == 0) || (this->input[psVar3[sVar2 - 1]] != '\0')) {
    sVar5 = strlen(this->input + offset);
    *base = sVar2 + 1;
    psVar3[sVar2] = sVar5 + offset;
  }
  if (local_d0 == 0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"unclosed quotation marks");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void JSON::exec_stage1() {
        uint64_t prev_escape_mask = 0;
        uint64_t prev_quote_mask = 0;
        uint64_t prev_pseudo_mask = 1;  // initial value set to 1 to allow literals at beginning of input
        uint64_t quote_mask, structural_mask, whitespace_mask;
        uint64_t pseudo_mask = 0;
        size_t offset = 0;
        for (; offset < input_len; offset += 64) {
            Warp warp(input + offset);
            uint64_t escape_mask = extract_escape_mask(warp, &prev_escape_mask);
            uint64_t literal_mask = extract_literal_mask(warp, escape_mask, &prev_quote_mask, &quote_mask);

            // Dump pointers for *previous* iteration.
            construct_structural_character_pointers(pseudo_mask, offset - 64, indices, &num_indices);

            extract_structural_whitespace_characters(warp, literal_mask, &structural_mask, &whitespace_mask);
            pseudo_mask = extract_pseudo_structural_mask(
                    structural_mask, whitespace_mask, quote_mask, literal_mask, &prev_pseudo_mask);
        }
        // Dump pointers for the final iteration.
        construct_structural_character_pointers(pseudo_mask, offset - 64, indices, &num_indices);
        if (num_indices == 0 || input[indices[num_indices - 1]] != '\0')  // Ensure '\0' is added to indices.
            indices[num_indices++] = offset - 64 + strlen(input + offset - 64);
        if (prev_quote_mask != 0)
            throw std::runtime_error("unclosed quotation marks");
    }